

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laswriteitemcompressed_v3.cpp
# Opt level: O2

void __thiscall
LASwriteItemCompressed_WAVEPACKET14_v3::~LASwriteItemCompressed_WAVEPACKET14_v3
          (LASwriteItemCompressed_WAVEPACKET14_v3 *this)

{
  ArithmeticModel *m;
  IntegerCompressor *pIVar1;
  ArithmeticEncoder *this_00;
  long lVar2;
  
  (this->super_LASwriteItemCompressed).super_LASwriteItem._vptr_LASwriteItem =
       (_func_int **)&PTR_write_00160420;
  for (lVar2 = 0; lVar2 != 0x1c0; lVar2 = lVar2 + 0x70) {
    m = *(ArithmeticModel **)((long)this->contexts[0].m_offset_diff + lVar2 + -8);
    if (m != (ArithmeticModel *)0x0) {
      ArithmeticEncoder::destroySymbolModel(this->enc_wavepacket,m);
      ArithmeticEncoder::destroySymbolModel
                (this->enc_wavepacket,
                 *(ArithmeticModel **)((long)this->contexts[0].m_offset_diff + lVar2));
      ArithmeticEncoder::destroySymbolModel
                (this->enc_wavepacket,
                 *(ArithmeticModel **)((long)this->contexts[0].m_offset_diff + lVar2 + 8));
      ArithmeticEncoder::destroySymbolModel
                (this->enc_wavepacket,
                 *(ArithmeticModel **)((long)this->contexts[0].m_offset_diff + lVar2 + 0x10));
      ArithmeticEncoder::destroySymbolModel
                (this->enc_wavepacket,
                 *(ArithmeticModel **)((long)this->contexts[0].m_offset_diff + lVar2 + 0x18));
      pIVar1 = *(IntegerCompressor **)((long)this->contexts[0].m_offset_diff + lVar2 + 0x20);
      if (pIVar1 != (IntegerCompressor *)0x0) {
        IntegerCompressor::~IntegerCompressor(pIVar1);
      }
      operator_delete(pIVar1);
      pIVar1 = *(IntegerCompressor **)((long)this->contexts[0].m_offset_diff + lVar2 + 0x28);
      if (pIVar1 != (IntegerCompressor *)0x0) {
        IntegerCompressor::~IntegerCompressor(pIVar1);
      }
      operator_delete(pIVar1);
      pIVar1 = *(IntegerCompressor **)((long)this->contexts[0].m_offset_diff + lVar2 + 0x30);
      if (pIVar1 != (IntegerCompressor *)0x0) {
        IntegerCompressor::~IntegerCompressor(pIVar1);
      }
      operator_delete(pIVar1);
      pIVar1 = *(IntegerCompressor **)((long)this->contexts[0].m_offset_diff + lVar2 + 0x38);
      if (pIVar1 != (IntegerCompressor *)0x0) {
        IntegerCompressor::~IntegerCompressor(pIVar1);
      }
      operator_delete(pIVar1);
    }
  }
  if (this->outstream_wavepacket != (ByteStreamOutArray *)0x0) {
    (*(this->outstream_wavepacket->super_ByteStreamOut)._vptr_ByteStreamOut[0xd])();
    this_00 = this->enc_wavepacket;
    if (this_00 != (ArithmeticEncoder *)0x0) {
      ArithmeticEncoder::~ArithmeticEncoder(this_00);
    }
    operator_delete(this_00);
    return;
  }
  return;
}

Assistant:

LASwriteItemCompressed_WAVEPACKET14_v3::~LASwriteItemCompressed_WAVEPACKET14_v3()
{
  /* destroy all initialized scanner channel contexts */

  U32 c;
  for (c = 0; c < 4; c++)
  {
    if (contexts[c].m_packet_index)
    {
      enc_wavepacket->destroySymbolModel(contexts[c].m_packet_index);
      enc_wavepacket->destroySymbolModel(contexts[c].m_offset_diff[0]);
      enc_wavepacket->destroySymbolModel(contexts[c].m_offset_diff[1]);
      enc_wavepacket->destroySymbolModel(contexts[c].m_offset_diff[2]);
      enc_wavepacket->destroySymbolModel(contexts[c].m_offset_diff[3]);
      delete contexts[c].ic_offset_diff;
      delete contexts[c].ic_packet_size;
      delete contexts[c].ic_return_point;
      delete contexts[c].ic_xyz;
    }
  }

  /* destroy all outstreams and encoders */

  if (outstream_wavepacket)
  {
    delete outstream_wavepacket;

    delete enc_wavepacket;
  }
}